

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool c4::yml::anon_unknown_0::_is_scalar_next__rseq_rval(csubstr s)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong in_RSI;
  char *in_RDI;
  ulong uVar5;
  bool bVar6;
  basic_substring<const_char> local_10;
  
  if (in_RSI == 0) {
LAB_001ed2b5:
    if (1 < in_RSI) {
      if (*in_RDI == '?') {
        lVar1 = 0;
        do {
          lVar4 = lVar1;
          if (lVar4 == 1) break;
          lVar1 = lVar4 + 1;
        } while (in_RDI[lVar4 + 1] == "? "[lVar4 + 1]);
        if (lVar4 != 0) goto LAB_001ed319;
      }
      if ((1 < in_RSI) && (*in_RDI == '-')) {
        lVar1 = 0;
        do {
          lVar4 = lVar1;
          if (lVar4 == 1) break;
          lVar1 = lVar4 + 1;
        } while (in_RDI[lVar4 + 1] == "--- "[lVar4 + 3]);
        if (lVar4 != 0) goto LAB_001ed319;
      }
    }
    iVar3 = basic_substring<const_char>::compare(&local_10,"-",1);
    bVar6 = iVar3 != 0;
  }
  else {
    if (*in_RDI != '[') {
      uVar2 = 0;
      do {
        uVar5 = uVar2;
        if (uVar5 == 3) break;
        uVar2 = uVar5 + 1;
      } while (*in_RDI != "[{!&"[uVar5 + 1]);
      if (2 < uVar5) goto LAB_001ed2b5;
    }
LAB_001ed319:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool _is_scalar_next__rseq_rval(csubstr s)
{
    return !(s.begins_with_any("[{!&") || s.begins_with("? ") || s.begins_with("- ") || s == "-");
}